

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableWidgetPrivate::setup(QTableWidgetPrivate *this)

{
  undefined8 *puVar1;
  QAbstractItemView *this_00;
  void **ppvVar2;
  QAbstractItemModel *pQVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 *puVar7;
  QItemSelectionModel *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  code *local_b8;
  ImplFn local_b0;
  code *local_a8;
  ImplFn local_a0;
  code *local_98;
  undefined8 local_90;
  Connection local_88;
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_98 = QAbstractItemView::pressed;
  lVar9 = 0;
  local_90 = 0;
  local_a8 = emitItemPressed;
  local_a0 = (ImplFn)0x0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemPressed;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_88,(void **)this_00,(QObject *)&local_98,(void **)this_00,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_98 = QAbstractItemView::clicked;
  local_90 = 0;
  local_a8 = emitItemClicked;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemClicked;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_80,(void **)this_00,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_98 = QAbstractItemView::doubleClicked;
  local_90 = 0;
  local_a8 = emitItemDoubleClicked;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemDoubleClicked;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_78,(void **)this_00,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_98 = QAbstractItemView::activated;
  local_90 = 0;
  local_a8 = emitItemActivated;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemActivated;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)this_00,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  local_98 = QAbstractItemView::entered;
  local_90 = 0;
  local_a8 = emitItemEntered;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemEntered;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)this_00,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar3 = (this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model;
  local_98 = QAbstractItemModel::dataChanged;
  local_90 = 0;
  local_a8 = emitItemChanged;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitItemChanged;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar3,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar8 = QAbstractItemView::selectionModel(this_00);
  local_98 = QItemSelectionModel::currentChanged;
  local_90 = 0;
  local_a8 = emitCurrentItemChanged;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = emitCurrentItemChanged;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar8,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar8 = QAbstractItemView::selectionModel(this_00);
  local_b8 = QTableWidget::itemSelectionChanged;
  local_b0 = (ImplFn)0x0;
  local_98 = QItemSelectionModel::selectionChanged;
  local_90 = 0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QCallableObject<void_(QTableWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar7 + 4) = QTableWidget::itemSelectionChanged;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_98,(void **)this_00,
             (QSlotObjectBase *)&local_b8,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar3 = (this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model;
  local_98 = QAbstractItemModel::dataChanged;
  local_90 = 0;
  local_a8 = dataChanged;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QTableWidgetPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar7 + 4) = dataChanged;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar3,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar3 = (this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model;
  local_98 = QAbstractItemModel::columnsRemoved;
  local_90 = 0;
  local_a8 = sort;
  local_a0 = (ImplFn)0x0;
  ppvVar2 = *(void ***)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTableWidgetPrivate::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar7 + 4) = sort;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar3,(QObject *)&local_98,ppvVar2,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  do {
    puVar1 = (undefined8 *)(&(this->connections).field_0x0 + lVar9 * 8);
    pvVar4 = (void *)*puVar1;
    uVar5 = puVar1[1];
    uVar6 = *(undefined8 *)(local_78 + lVar9 * 8 + -8);
    puVar1 = (undefined8 *)(&(this->connections).field_0x0 + lVar9 * 8);
    *puVar1 = (&local_88)[lVar9].d_ptr;
    puVar1[1] = uVar6;
    (&local_88)[lVar9].d_ptr = pvVar4;
    *(undefined8 *)(local_78 + lVar9 * 8 + -8) = uVar5;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 10);
  lVar9 = 0x48;
  do {
    QMetaObject::Connection::~Connection((Connection *)((long)&local_88.d_ptr + lVar9));
    lVar9 = lVar9 + -8;
  } while (lVar9 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetPrivate::setup()
{
    Q_Q(QTableWidget);
    connections = {
        // view signals
        QObjectPrivate::connect(q, &QTableWidget::pressed,
                                this, &QTableWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(q, &QTableWidget::clicked,
                                this, &QTableWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(q, &QTableWidget::doubleClicked,
                                this, &QTableWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(q, &QTableWidget::activated,
                                this, &QTableWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(q, &QTableWidget::entered,
                                this, &QTableWidgetPrivate::emitItemEntered),
        // model signals
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QTableWidgetPrivate::emitItemChanged),
        // selection signals
        QObjectPrivate::connect(q->selectionModel(), &QItemSelectionModel::currentChanged,
                                this, &QTableWidgetPrivate::emitCurrentItemChanged),
        QObject::connect(q->selectionModel(), &QItemSelectionModel::selectionChanged,
                         q, &QTableWidget::itemSelectionChanged),
        // sorting
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QTableWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::columnsRemoved,
                                this, &QTableWidgetPrivate::sort)
    };
}